

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

void __thiscall
google::protobuf::util::MessageDifferencer::TreatAsMap
          (MessageDifferencer *this,FieldDescriptor *field,FieldDescriptor *key)

{
  Descriptor *pDVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  Descriptor *pDVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  MultipleFieldsMapKeyComparator *pMVar7;
  mapped_type *ppMVar8;
  MultipleFieldsMapKeyComparator *local_70;
  MapKeyComparator *key_comparator;
  FieldDescriptor *local_38;
  FieldDescriptor *field_local;
  
  local_38 = field;
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_MESSAGE) {
    protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xffffffffffffff90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/message_differencer.cc"
               ,0x169);
    pLVar3 = protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)&stack0xffffffffffffff90,
                        "CHECK failed: (FieldDescriptor::CPPTYPE_MESSAGE) == (field->cpp_type()): ")
    ;
    pLVar3 = protobuf::internal::LogMessage::operator<<
                       (pLVar3,"Field has to be message type.  Field name is: ");
    pLVar3 = protobuf::internal::LogMessage::operator<<(pLVar3,*(string **)(field + 8));
    protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&field_local + 7),pLVar3);
    protobuf::internal::LogMessage::~LogMessage((LogMessage *)&stack0xffffffffffffff90);
  }
  pDVar1 = *(Descriptor **)(key + 0x50);
  pDVar4 = FieldDescriptor::message_type(field);
  if (pDVar1 != pDVar4) {
    protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xffffffffffffff90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/message_differencer.cc"
               ,0x16b);
    pLVar3 = protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)&stack0xffffffffffffff90,
                        "CHECK failed: key->containing_type() == field->message_type(): ");
    pLVar3 = protobuf::internal::LogMessage::operator<<(pLVar3,*(string **)(key + 8));
    pLVar3 = protobuf::internal::LogMessage::operator<<
                       (pLVar3," must be a direct subfield within the repeated field ");
    pLVar3 = protobuf::internal::LogMessage::operator<<(pLVar3,*(string **)(field + 8));
    pLVar3 = protobuf::internal::LogMessage::operator<<(pLVar3,", not ");
    pLVar3 = protobuf::internal::LogMessage::operator<<
                       (pLVar3,*(string **)(*(long *)(key + 0x50) + 8));
    protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&field_local + 7),pLVar3);
    protobuf::internal::LogMessage::~LogMessage((LogMessage *)&stack0xffffffffffffff90);
  }
  iVar5 = std::
          _Rb_tree<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>,_std::_Select1st<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
          ::find(&(this->repeated_field_comparisons_)._M_t,&local_38);
  if ((_Rb_tree_header *)iVar5._M_node !=
      &(this->repeated_field_comparisons_)._M_t._M_impl.super__Rb_tree_header) {
    protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xffffffffffffff90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/message_differencer.cc"
               ,0x170);
    pLVar3 = protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)&stack0xffffffffffffff90,
                        "CHECK failed: repeated_field_comparisons_.find(field) == repeated_field_comparisons_.end(): "
                       );
    pLVar3 = protobuf::internal::LogMessage::operator<<
                       (pLVar3,"Cannot treat the same field as both ");
    pmVar6 = std::
             map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
             ::operator[](&this->repeated_field_comparisons_,&local_38);
    pLVar3 = protobuf::internal::LogMessage::operator<<(pLVar3,*pmVar6);
    pLVar3 = protobuf::internal::LogMessage::operator<<(pLVar3," and MAP. Field name is: ");
    pLVar3 = protobuf::internal::LogMessage::operator<<(pLVar3,*(string **)(local_38 + 8));
    protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&field_local + 7),pLVar3);
    protobuf::internal::LogMessage::~LogMessage((LogMessage *)&stack0xffffffffffffff90);
  }
  pMVar7 = (MultipleFieldsMapKeyComparator *)operator_new(0x28);
  MultipleFieldsMapKeyComparator::MultipleFieldsMapKeyComparator(pMVar7,this,key);
  local_70 = pMVar7;
  std::
  vector<google::protobuf::util::MessageDifferencer::MapKeyComparator_*,_std::allocator<google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>
  ::push_back(&this->owned_key_comparators_,(value_type *)&stack0xffffffffffffff90);
  pMVar7 = local_70;
  ppMVar8 = std::
            map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
            ::operator[](&this->map_field_key_comparator_,&local_38);
  *ppMVar8 = &pMVar7->super_MapKeyComparator;
  return;
}

Assistant:

void MessageDifferencer::TreatAsMap(const FieldDescriptor* field,
                                    const FieldDescriptor* key) {
  GOOGLE_CHECK_EQ(FieldDescriptor::CPPTYPE_MESSAGE, field->cpp_type())
      << "Field has to be message type.  Field name is: " << field->full_name();
  GOOGLE_CHECK(key->containing_type() == field->message_type())
      << key->full_name()
      << " must be a direct subfield within the repeated field "
      << field->full_name() << ", not " << key->containing_type()->full_name();
  GOOGLE_CHECK(repeated_field_comparisons_.find(field) ==
        repeated_field_comparisons_.end())
      << "Cannot treat the same field as both "
      << repeated_field_comparisons_[field]
      << " and MAP. Field name is: " << field->full_name();
  MapKeyComparator* key_comparator =
      new MultipleFieldsMapKeyComparator(this, key);
  owned_key_comparators_.push_back(key_comparator);
  map_field_key_comparator_[field] = key_comparator;
}